

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_bcwrite.c
# Opt level: O2

void bcwrite_ktabk(BCWriteCtx *ctx,cTValue *o,int narrow)

{
  double dVar1;
  uint uVar2;
  MSize len;
  uint uVar3;
  ulong uVar4;
  uint32_t uVar5;
  
  if ((ctx->sb).sz < (ctx->sb).n + 0xb) {
    bcwrite_resize(ctx,0xb);
  }
  uVar2 = (o->field_2).it;
  if (uVar2 == 0xfffffffb) {
    uVar2 = (o->u32).lo;
    len = *(MSize *)((ulong)uVar2 + 0xc);
    uVar5 = len + 5;
    if ((ctx->sb).sz < (ctx->sb).n + uVar5) {
      bcwrite_resize(ctx,uVar5);
    }
    bcwrite_uleb128(ctx,uVar5);
    bcwrite_block(ctx,(void *)((ulong)uVar2 + 0x10),len);
    return;
  }
  if (0xfffefffe < uVar2) {
    uVar3 = (ctx->sb).n;
    (ctx->sb).n = uVar3 + 1;
    (ctx->sb).buf[uVar3] = ~(byte)uVar2;
    return;
  }
  if (narrow == 0) {
    uVar4 = (ulong)(ctx->sb).n;
  }
  else {
    dVar1 = o->n;
    uVar2 = (ctx->sb).n;
    uVar4 = (ulong)uVar2;
    if ((dVar1 == (double)(int)dVar1) && (!NAN(dVar1) && !NAN((double)(int)dVar1))) {
      uVar5 = (uint32_t)dVar1;
      (ctx->sb).n = uVar2 + 1;
      (ctx->sb).buf[uVar4] = '\x03';
      goto LAB_00119e35;
    }
  }
  (ctx->sb).n = (int)uVar4 + 1;
  (ctx->sb).buf[uVar4] = '\x04';
  bcwrite_uleb128(ctx,(o->u32).lo);
  uVar5 = (o->field_2).it;
LAB_00119e35:
  bcwrite_uleb128(ctx,uVar5);
  return;
}

Assistant:

static void bcwrite_ktabk(BCWriteCtx *ctx, cTValue *o, int narrow)
{
  bcwrite_need(ctx, 1+10);
  if (tvisstr(o)) {
    const GCstr *str = strV(o);
    MSize len = str->len;
    bcwrite_need(ctx, 5+len);
    bcwrite_uleb128(ctx, BCDUMP_KTAB_STR+len);
    bcwrite_block(ctx, strdata(str), len);
  } else if (tvisint(o)) {
    bcwrite_byte(ctx, BCDUMP_KTAB_INT);
    bcwrite_uleb128(ctx, intV(o));
  } else if (tvisnum(o)) {
    if (!LJ_DUALNUM && narrow) {  /* Narrow number constants to integers. */
      lua_Number num = numV(o);
      int32_t k = lj_num2int(num);
      if (num == (lua_Number)k) {  /* -0 is never a constant. */
	bcwrite_byte(ctx, BCDUMP_KTAB_INT);
	bcwrite_uleb128(ctx, k);
	return;
      }
    }
    bcwrite_byte(ctx, BCDUMP_KTAB_NUM);
    bcwrite_uleb128(ctx, o->u32.lo);
    bcwrite_uleb128(ctx, o->u32.hi);
  } else {
    lua_assert(tvispri(o));
    bcwrite_byte(ctx, BCDUMP_KTAB_NIL+~itype(o));
  }
}